

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comm.hpp
# Opt level: O2

GlobalPtr<int> BCL::broadcast<BCL::GlobalPtr<int>>(GlobalPtr<int> *val,uint64_t root)

{
  int __val;
  debug_error *this;
  string sStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  __val = MPI_Bcast(val,0x10,&ompi_mpi_char,root,comm);
  if (__val == 0) {
    return *val;
  }
  this = (debug_error *)__cxa_allocate_exception(0x40);
  std::__cxx11::to_string(&sStack_58,__val);
  std::operator+(&local_38,"BCL broadcast(): MPI_Bcast return error code ",&sStack_58);
  debug_error::debug_error(this,&local_38);
  __cxa_throw(this,&debug_error::typeinfo,debug_error::~debug_error);
}

Assistant:

inline T broadcast(T &val, uint64_t root) {
  int error_code = MPI_Bcast(&val, sizeof(T), MPI_CHAR, root, BCL::comm);
  BCL_DEBUG(
          if (error_code != MPI_SUCCESS) {
            throw debug_error("BCL broadcast(): MPI_Bcast return error code " + std::to_string(error_code));
          }
  )
  return val;
}